

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

string * __thiscall network_pimpl::getHardware_endpoint_abi_cxx11_(network_pimpl *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0xd8));
  return in_RDI;
}

Assistant:

std::string network_pimpl::getHardware_endpoint() const
{
return hardware_endpoint;
}